

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

ProviderPtr __thiscall IlmThread_3_4::ThreadPool::Data::getProvider(Data *this)

{
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> *in_RDI;
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> sVar1;
  ProviderPtr PVar2;
  
  sVar1 = std::atomic_load<IlmThread_3_4::ThreadPoolProvider>(in_RDI);
  PVar2.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.
                super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  PVar2.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ProviderPtr)
         PVar2.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ProviderPtr getProvider () const { return std::atomic_load (&_provider); }